

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromaclique.cpp
# Opt level: O0

unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
* readSwitchRateFile(string *filePath)

{
  byte bVar1;
  bool bVar2;
  ostream *this;
  ulong uVar3;
  char *pcVar4;
  string *in_RSI;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *in_RDI;
  double dVar5;
  int i;
  string switchRate;
  string distance;
  int counter;
  string line;
  ifstream input;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *switchRateMap;
  size_t *in_stack_fffffffffffffcb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc0;
  int local_2a8;
  allocator local_2a1;
  string local_2a0 [39];
  allocator local_279;
  string local_278 [32];
  int local_258;
  allocator local_251;
  string local_250 [48];
  istream local_220 [527];
  byte local_11;
  
  local_11 = 0;
  std::
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   *)0x22366f);
  std::ifstream::ifstream(local_220,in_RSI,_S_in);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"",&local_251);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    this = std::operator<<((ostream *)&std::cerr,"Error opening transition rate file ");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  do {
    do {
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_250);
      bVar1 = std::ios::good();
      if ((bVar1 & 1) == 0) {
        local_11 = 1;
        std::__cxx11::string::~string(local_250);
        std::ifstream::~ifstream(local_220);
        if ((local_11 & 1) == 0) {
          std::
          unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
          ::~unordered_map((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                            *)0x223af5);
        }
        return in_RDI;
      }
      uVar3 = std::__cxx11::string::empty();
    } while ((uVar3 & 1) != 0);
    local_258 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_278,"",&local_279);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a0,"",&local_2a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    for (local_2a8 = 0; uVar3 = std::__cxx11::string::size(), (ulong)(long)local_2a8 < uVar3;
        local_2a8 = local_2a8 + 1) {
      pcVar4 = (char *)std::__cxx11::string::at((ulong)local_250);
      if (*pcVar4 == ' ') {
        if (local_258 == 0) {
          local_258 = 1;
        }
        else {
          bVar2 = std::operator!=(in_stack_fffffffffffffcc0,(char *)in_stack_fffffffffffffcb8);
          if (bVar2) break;
        }
      }
      else if (local_258 == 0) {
        pcVar4 = (char *)std::__cxx11::string::at((ulong)local_250);
        std::__cxx11::string::operator+=(local_278,*pcVar4);
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::at((ulong)local_250);
        std::__cxx11::string::operator+=(local_2a0,*pcVar4);
      }
    }
    dVar5 = std::__cxx11::stod(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    std::__cxx11::stoi(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,0);
    in_stack_fffffffffffffcc0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
         ::operator[]((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                       *)in_stack_fffffffffffffcc0,(key_type *)in_stack_fffffffffffffcb8);
    *(double *)in_stack_fffffffffffffcc0 = dVar5;
    std::__cxx11::string::~string(local_2a0);
    std::__cxx11::string::~string(local_278);
  } while( true );
}

Assistant:

std::unordered_map<int, double> readSwitchRateFile(string filePath){
    std::unordered_map<int, double> switchRateMap;
    std::ifstream input(filePath);
    std::string line="";
    if(!input.good()){
            std::cerr << "Error opening transition rate file "<< std::endl;
            //return reference;
    }
    while( std::getline( input, line ).good() ){
        if( line.empty()){
            continue;
        }else {
            int counter = 0;
            string distance = "";
            string switchRate = "";
            for(int i = 0 ; i<line.size() ; i++){
                if(line.at(i)!= ' '){
                    if(counter == 0){
                        distance += line.at(i);
                    }else{
                        switchRate += line.at(i);
                    }
                }else{
                    if(counter == 0){
                        counter += 1;
                    }else{
                        if(switchRate != "")
                            break;
                    }
                }
            }

           //why 1-std::stod(switchRate)? switchRateMap[std::stoi(distance)] = 1-std::stod(switchRate);
            switchRateMap[std::stoi(distance)] = std::stod(switchRate);
        }
    }
    //cout<<switchRateMap<<endl;
    return switchRateMap;
}